

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dhm.c
# Opt level: O0

int mbedtls_dhm_set_group(mbedtls_dhm_context *ctx,mbedtls_mpi *P,mbedtls_mpi *G)

{
  size_t sVar1;
  int local_2c;
  int ret;
  mbedtls_mpi *G_local;
  mbedtls_mpi *P_local;
  mbedtls_dhm_context *ctx_local;
  
  local_2c = mbedtls_mpi_copy(&ctx->P,P);
  if ((local_2c == 0) && (local_2c = mbedtls_mpi_copy(&ctx->G,G), local_2c == 0)) {
    sVar1 = mbedtls_mpi_size(&ctx->P);
    ctx->len = sVar1;
    return 0;
  }
  return local_2c + -0x3580;
}

Assistant:

int mbedtls_dhm_set_group( mbedtls_dhm_context *ctx,
                           const mbedtls_mpi *P,
                           const mbedtls_mpi *G )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    DHM_VALIDATE_RET( ctx != NULL );
    DHM_VALIDATE_RET( P != NULL );
    DHM_VALIDATE_RET( G != NULL );

    if( ( ret = mbedtls_mpi_copy( &ctx->P, P ) ) != 0 ||
        ( ret = mbedtls_mpi_copy( &ctx->G, G ) ) != 0 )
    {
        return( MBEDTLS_ERR_DHM_SET_GROUP_FAILED + ret );
    }

    ctx->len = mbedtls_mpi_size( &ctx->P );
    return( 0 );
}